

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrintOnOneLine(char *str,int max_length)

{
  int in_ESI;
  char *in_RDI;
  int i;
  int local_10;
  char *local_8;
  
  if (in_RDI != (char *)0x0) {
    local_10 = 0;
    for (local_8 = in_RDI; *local_8 != '\0'; local_8 = local_8 + 1) {
      if (in_ESI <= local_10) {
        printf("...");
        return;
      }
      if (*local_8 == '\n') {
        printf("\\n");
        local_10 = local_10 + 2;
      }
      else {
        printf("%c",(ulong)(uint)(int)*local_8);
        local_10 = local_10 + 1;
      }
    }
  }
  return;
}

Assistant:

static void PrintOnOneLine(const char* str, int max_length) {
  if (str != NULL) {
    for (int i = 0; *str != '\0'; ++str) {
      if (i >= max_length) {
        printf("...");
        break;
      }
      if (*str == '\n') {
        printf("\\n");
        i += 2;
      } else {
        printf("%c", *str);
        ++i;
      }
    }
  }
}